

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::MinSampleShadingInstance::verifyImage
          (TestStatus *__return_storage_ptr__,MinSampleShadingInstance *this,
          ConstPixelBufferAccess *testShadingImage,ConstPixelBufferAccess *minShadingImage,
          ConstPixelBufferAccess *maxShadingImage)

{
  ostringstream *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  dVar1 = getUniqueColorsCount(testShadingImage);
  dVar2 = getUniqueColorsCount(minShadingImage);
  dVar3 = getUniqueColorsCount(maxShadingImage);
  local_1a8._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\nColors found: ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Min. colors expected: ",0x16);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Max. colors expected: ",0x16);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  local_1a8._0_8_ = local_198;
  if (dVar1 < dVar2 || dVar3 < dVar1) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Unique colors out of expected bounds","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
               (long)(qpTestLog **)local_1a8._0_8_ + local_1a8._8_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Unique colors within expected bounds","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
               (long)(qpTestLog **)local_1a8._0_8_ + local_1a8._8_8_);
  }
  if ((TestLog *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198[0].m_log)->flags + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MinSampleShadingInstance::verifyImage (const tcu::ConstPixelBufferAccess& testShadingImage, const tcu::ConstPixelBufferAccess& minShadingImage, const tcu::ConstPixelBufferAccess& maxShadingImage)
{
	const deUint32	testColorCount	= getUniqueColorsCount(testShadingImage);
	const deUint32	minColorCount	= getUniqueColorsCount(minShadingImage);
	const deUint32	maxColorCount	= getUniqueColorsCount(maxShadingImage);

	tcu::TestLog& log = m_context.getTestContext().getLog();

	log << tcu::TestLog::Message
		<< "\nColors found: " << testColorCount << "\n"
		<< "Min. colors expected: " << minColorCount << "\n"
		<< "Max. colors expected: " << maxColorCount << "\n"
		<< tcu::TestLog::EndMessage;

	if (minColorCount > testColorCount || testColorCount > maxColorCount)
		return tcu::TestStatus::fail("Unique colors out of expected bounds");
	else
		return tcu::TestStatus::pass("Unique colors within expected bounds");
}